

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::binder5<disp>::operator()
          (binder5<disp> *this,string *p1,string *p2,string *p3,string *p4,string *p5)

{
  application *paVar1;
  code *pcVar2;
  page_guard<disp,_void> guard;
  page_guard<disp,_void> local_e8;
  string *local_e0;
  string *local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_e8.object_ = &this->object->super_application;
  local_e0 = p5;
  local_d8 = p4;
  (**(code **)(*(long *)local_e8.object_ + 0x18))();
  pcVar2 = (code *)this->member;
  paVar1 = &this->object->super_application + *(long *)&this->field_0x8;
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *(long *)paVar1 + -1);
  }
  std::__cxx11::string::string(local_50,(string *)p1);
  std::__cxx11::string::string(local_70,(string *)p2);
  std::__cxx11::string::string(local_90,(string *)p3);
  std::__cxx11::string::string(local_b0,(string *)local_d8);
  std::__cxx11::string::string(local_d0,(string *)local_e0);
  (*pcVar2)(paVar1,local_50,local_70,local_90,local_b0,local_d0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  page_guard<disp,_void>::~page_guard(&local_e8);
  return;
}

Assistant:

void operator()(std::string p1,std::string p2,std::string p3,std::string p4,std::string p5) const
			{
				page_guard<C> guard(object);
				(object->*member)(p1,p2,p3,p4,p5);
			}